

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void EmitDebugSectionImpl
               (Data *DI,EmitFuncType EmitFunc,StringRef Sec,
               StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
               *OutputBuffers)

{
  ulong uVar1;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *this;
  StringRef InputData;
  Twine local_c0;
  StringRef local_a8;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_98 [3];
  undefined1 local_80 [8];
  raw_string_ostream DebugInfoStream;
  string Data;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  *OutputBuffers_local;
  EmitFuncType EmitFunc_local;
  Data *DI_local;
  StringRef Sec_local;
  
  std::__cxx11::string::string((string *)&DebugInfoStream.OS);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_80,(string *)&DebugInfoStream.OS);
  (*EmitFunc)((raw_ostream *)local_80,DI);
  llvm::raw_ostream::flush((raw_ostream *)local_80);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    llvm::StringRef::StringRef(&local_a8,(string *)&DebugInfoStream.OS);
    llvm::Twine::Twine(&local_c0,"");
    InputData.Length = (size_t)local_a8.Data;
    InputData.Data = (char *)local_98;
    llvm::MemoryBuffer::getMemBufferCopy(InputData,(Twine *)local_a8.Length);
    this = llvm::
           StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
           ::operator[](OutputBuffers,Sec);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
              (this,local_98);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (local_98);
  }
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_80);
  std::__cxx11::string::~string((string *)&DebugInfoStream.OS);
  return;
}

Assistant:

static void
EmitDebugSectionImpl(const DWARFYAML::Data &DI, EmitFuncType EmitFunc,
                     StringRef Sec,
                     StringMap<std::unique_ptr<MemoryBuffer>> &OutputBuffers) {
  std::string Data;
  raw_string_ostream DebugInfoStream(Data);
  EmitFunc(DebugInfoStream, DI);
  DebugInfoStream.flush();
  if (!Data.empty())
    OutputBuffers[Sec] = MemoryBuffer::getMemBufferCopy(Data);
}